

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O1

void MpiDisconnectWriterPerReader(CP_Services Svcs,DP_WSR_Stream WSR_Stream_v)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = *WSR_Stream_v;
  (*Svcs->verbose)((void *)**(undefined8 **)((long)WSR_Stream_v + 0x18),5,
                   "MpiDisconnectWriterPerReader invoked [rank:%d;cohortSize:%d]\n",(ulong)uVar1,
                   (ulong)*(uint *)(*(undefined8 **)((long)WSR_Stream_v + 0x18) + 1));
  if (0 < (long)(int)uVar1) {
    lVar2 = 0;
    do {
      if (*(undefined **)(*(long *)((long)WSR_Stream_v + 0x78) + lVar2) != &ompi_mpi_comm_null) {
        MPI_Comm_disconnect(*(long *)((long)WSR_Stream_v + 0x78) + lVar2);
      }
      lVar2 = lVar2 + 8;
    } while ((long)(int)uVar1 * 8 != lVar2);
  }
  return;
}

Assistant:

static void MpiDisconnectWriterPerReader(CP_Services Svcs, DP_WSR_Stream WSR_Stream_v)
{
    MpiStreamWPR StreamWPR = (MpiStreamWPR)WSR_Stream_v;
    MpiStreamWR StreamWR = StreamWPR->StreamWR;

    const int CohortSize = StreamWPR->Link.CohortSize;

    Svcs->verbose(StreamWR->Stream.CP_Stream, DPTraceVerbose,
                  "MpiDisconnectWriterPerReader invoked [rank:%d;cohortSize:%d]\n", CohortSize,
                  StreamWR->Stream.Rank);

    for (int i = 0; i < CohortSize; i++)
    {
        if (StreamWPR->CohortMpiComms[i] != MPI_COMM_NULL)
        {
            MPI_Comm_disconnect(&StreamWPR->CohortMpiComms[i]);
        }
    }
}